

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_RESPONSE_HANDLE sasl_response_create(amqp_binary response_value)

{
  int iVar1;
  SASL_RESPONSE_INSTANCE_TAG SVar2;
  AMQP_VALUE item_value;
  amqp_binary value;
  undefined4 local_2c;
  int result;
  AMQP_VALUE response_amqp_value;
  SASL_RESPONSE_INSTANCE *sasl_response_instance;
  amqp_binary response_value_local;
  
  response_amqp_value = (AMQP_VALUE)malloc(8);
  if (response_amqp_value != (AMQP_VALUE)0x0) {
    SVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x43);
    *(AMQP_VALUE *)response_amqp_value = SVar2.composite_value;
    if (*(AMQP_VALUE *)response_amqp_value == (AMQP_VALUE)0x0) {
      free(response_amqp_value);
      response_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_2c = 0;
      value._12_4_ = 0;
      value.bytes = (void *)SUB128(response_value._0_12_,0);
      value.length = SUB124(response_value._0_12_,8);
      item_value = amqpvalue_create_binary(value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)response_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_2c = 0x2c11;
      }
      amqpvalue_destroy(item_value);
      if (local_2c != 0) {
        sasl_response_destroy((SASL_RESPONSE_HANDLE)response_amqp_value);
        response_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (SASL_RESPONSE_HANDLE)response_amqp_value;
}

Assistant:

SASL_RESPONSE_HANDLE sasl_response_create(amqp_binary response_value)
{
    SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)malloc(sizeof(SASL_RESPONSE_INSTANCE));
    if (sasl_response_instance != NULL)
    {
        sasl_response_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(67);
        if (sasl_response_instance->composite_value == NULL)
        {
            free(sasl_response_instance);
            sasl_response_instance = NULL;
        }
        else
        {
            AMQP_VALUE response_amqp_value;
            int result = 0;

            response_amqp_value = amqpvalue_create_binary(response_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_response_instance->composite_value, 0, response_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(response_amqp_value);
            if (result != 0)
            {
                sasl_response_destroy(sasl_response_instance);
                sasl_response_instance = NULL;
            }
        }
    }

    return sasl_response_instance;
}